

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O0

Error * __thiscall
libsbox::Task::
deserialize_response<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Error *__return_storage_ptr__,Task *this,Value *value)

{
  bool bVar1;
  int iVar2;
  Type pGVar3;
  int64_t iVar4;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_20;
  Value *value_local;
  Task *this_local;
  
  local_20 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)value;
  value_local = (Value *)this;
  this_local = (Task *)__return_storage_ptr__;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject(value);
  if (bVar1) {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)local_20,"time_usage_ms");
    if (bVar1) {
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(local_20,"time_usage_ms");
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsInt64(pGVar3);
      if (bVar1) {
        pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(local_20,"time_usage_ms");
        iVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt64(pGVar3);
        this->time_usage_ms_ = iVar4;
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)local_20,"time_usage_sys_ms");
        if (bVar1) {
          pGVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(local_20,"time_usage_sys_ms");
          bVar1 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::IsInt64(pGVar3);
          if (bVar1) {
            pGVar3 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>(local_20,"time_usage_sys_ms");
            iVar4 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetInt64(pGVar3);
            this->time_usage_sys_ms_ = iVar4;
            bVar1 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)local_20,"time_usage_user_ms");
            if (bVar1) {
              pGVar3 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>(local_20,"time_usage_user_ms");
              bVar1 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::IsInt64(pGVar3);
              if (bVar1) {
                pGVar3 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>(local_20,"time_usage_user_ms");
                iVar4 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::GetInt64(pGVar3);
                this->time_usage_user_ms_ = iVar4;
                bVar1 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                     *)local_20,"wall_time_usage_ms");
                if (bVar1) {
                  pGVar3 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>(local_20,"wall_time_usage_ms");
                  bVar1 = rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::IsInt64(pGVar3);
                  if (bVar1) {
                    pGVar3 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             ::operator[]<char_const>(local_20,"wall_time_usage_ms");
                    iVar4 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::GetInt64(pGVar3);
                    this->wall_time_usage_ms_ = iVar4;
                    bVar1 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                         *)local_20,"memory_usage_kb");
                    if (bVar1) {
                      pGVar3 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>(local_20,"memory_usage_kb");
                      bVar1 = rapidjson::
                              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              ::IsInt64(pGVar3);
                      if (bVar1) {
                        pGVar3 = rapidjson::
                                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 ::operator[]<char_const>(local_20,"memory_usage_kb");
                        iVar4 = rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::GetInt64(pGVar3);
                        this->memory_usage_kb_ = iVar4;
                        bVar1 = rapidjson::
                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                             *)local_20,"time_limit_exceeded");
                        if (bVar1) {
                          pGVar3 = rapidjson::
                                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   ::operator[]<char_const>(local_20,"time_limit_exceeded");
                          bVar1 = rapidjson::
                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  ::IsBool(pGVar3);
                          if (bVar1) {
                            pGVar3 = rapidjson::
                                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     ::operator[]<char_const>(local_20,"time_limit_exceeded");
                            bVar1 = rapidjson::
                                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    ::GetBool(pGVar3);
                            this->time_limit_exceeded_ = bVar1;
                            bVar1 = rapidjson::
                                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                 *)local_20,"wall_time_limit_exceeded");
                            if (bVar1) {
                              pGVar3 = rapidjson::
                                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       ::operator[]<char_const>(local_20,"wall_time_limit_exceeded")
                              ;
                              bVar1 = rapidjson::
                                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                      ::IsBool(pGVar3);
                              if (bVar1) {
                                pGVar3 = rapidjson::
                                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                         ::operator[]<char_const>
                                                   (local_20,"wall_time_limit_exceeded");
                                bVar1 = rapidjson::
                                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        ::GetBool(pGVar3);
                                this->wall_time_limit_exceeded_ = bVar1;
                                bVar1 = rapidjson::
                                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        ::HasMember((
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)local_20,"exited");
                                if (bVar1) {
                                  pGVar3 = rapidjson::
                                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                           ::operator[]<char_const>(local_20,"exited");
                                  bVar1 = rapidjson::
                                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                          ::IsBool(pGVar3);
                                  if (bVar1) {
                                    pGVar3 = rapidjson::
                                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                             ::operator[]<char_const>(local_20,"exited");
                                    bVar1 = rapidjson::
                                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            ::GetBool(pGVar3);
                                    this->exited_ = bVar1;
                                    bVar1 = rapidjson::
                                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                            ::HasMember((
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)local_20,"exit_code");
                                    if (bVar1) {
                                      pGVar3 = rapidjson::
                                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                               ::operator[]<char_const>(local_20,"exit_code");
                                      bVar1 = rapidjson::
                                              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                              ::IsInt(pGVar3);
                                      if (bVar1) {
                                        pGVar3 = rapidjson::
                                                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                 ::operator[]<char_const>(local_20,"exit_code");
                                        iVar2 = rapidjson::
                                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                ::GetInt(pGVar3);
                                        this->exit_code_ = iVar2;
                                        bVar1 = rapidjson::
                                                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                ::HasMember((
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)local_20,"signaled");
                                        if (bVar1) {
                                          pGVar3 = rapidjson::
                                                                                                      
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>(local_20,"signaled");
                                          bVar1 = rapidjson::
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::IsBool(pGVar3);
                                          if (bVar1) {
                                            pGVar3 = rapidjson::
                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>(local_20,"signaled");
                                            bVar1 = rapidjson::
                                                                                                        
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::GetBool(pGVar3);
                                            this->signaled_ = bVar1;
                                            bVar1 = rapidjson::
                                                                                                        
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::HasMember((
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)local_20,"term_signal");
                                            if (bVar1) {
                                              pGVar3 = rapidjson::
                                                                                                              
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>(local_20,"term_signal");
                                              bVar1 = rapidjson::
                                                                                                            
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::IsInt(pGVar3);
                                              if (bVar1) {
                                                pGVar3 = rapidjson::
                                                                                                                  
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>(local_20,"term_signal");
                                                iVar2 = rapidjson::
                                                                                                                
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::GetInt(pGVar3);
                                                this->term_signal_ = iVar2;
                                                bVar1 = rapidjson::
                                                                                                                
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::HasMember((
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)local_20,"oom_killed");
                                                if (bVar1) {
                                                  pGVar3 = rapidjson::
                                                                                                                      
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>(local_20,"oom_killed");
                                                  bVar1 = rapidjson::
                                                                                                                    
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::IsBool(pGVar3);
                                                  if (bVar1) {
                                                    pGVar3 = rapidjson::
                                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>(local_20,"oom_killed");
                                                  bVar1 = rapidjson::
                                                                                                                    
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::GetBool(pGVar3);
                                                  this->oom_killed_ = bVar1;
                                                  bVar1 = rapidjson::
                                                                                                                    
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::HasMember((
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)local_20,"memory_limit_hit");
                                                  if (bVar1) {
                                                    pGVar3 = rapidjson::
                                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            (local_20,"memory_limit_hit");
                                                  bVar1 = rapidjson::
                                                                                                                    
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::IsBool(pGVar3);
                                                  if (bVar1) {
                                                    pGVar3 = rapidjson::
                                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            (local_20,"memory_limit_hit");
                                                  bVar1 = rapidjson::
                                                                                                                    
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::GetBool(pGVar3);
                                                  this->memory_limit_hit_ = bVar1;
                                                  memset(__return_storage_ptr__,0,0x20);
                                                  Error::Error(__return_storage_ptr__);
                                                  }
                                                  else {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_460,
                                                               "Response JSON is incorrect",
                                                               &local_461);
                                                    Error::Error(__return_storage_ptr__,&local_460);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_460);
                                                    std::allocator<char>::~allocator(&local_461);
                                                  }
                                                  }
                                                  else {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_438,
                                                               "Response JSON is incorrect",
                                                               &local_439);
                                                    Error::Error(__return_storage_ptr__,&local_438);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_438);
                                                    std::allocator<char>::~allocator(&local_439);
                                                  }
                                                  }
                                                  else {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_410,
                                                               "Response JSON is incorrect",
                                                               &local_411);
                                                    Error::Error(__return_storage_ptr__,&local_410);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_410);
                                                    std::allocator<char>::~allocator(&local_411);
                                                  }
                                                }
                                                else {
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_3e8,
                                                             "Response JSON is incorrect",&local_3e9
                                                            );
                                                  Error::Error(__return_storage_ptr__,&local_3e8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_3e8);
                                                  std::allocator<char>::~allocator(&local_3e9);
                                                }
                                              }
                                              else {
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_3c0,
                                                           "Response JSON is incorrect",&local_3c1);
                                                Error::Error(__return_storage_ptr__,&local_3c0);
                                                std::__cxx11::string::~string((string *)&local_3c0);
                                                std::allocator<char>::~allocator(&local_3c1);
                                              }
                                            }
                                            else {
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_398,
                                                         "Response JSON is incorrect",&local_399);
                                              Error::Error(__return_storage_ptr__,&local_398);
                                              std::__cxx11::string::~string((string *)&local_398);
                                              std::allocator<char>::~allocator(&local_399);
                                            }
                                          }
                                          else {
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_370,
                                                       "Response JSON is incorrect",&local_371);
                                            Error::Error(__return_storage_ptr__,&local_370);
                                            std::__cxx11::string::~string((string *)&local_370);
                                            std::allocator<char>::~allocator(&local_371);
                                          }
                                        }
                                        else {
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_348,
                                                     "Response JSON is incorrect",&local_349);
                                          Error::Error(__return_storage_ptr__,&local_348);
                                          std::__cxx11::string::~string((string *)&local_348);
                                          std::allocator<char>::~allocator(&local_349);
                                        }
                                      }
                                      else {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_320,"Response JSON is incorrect"
                                                   ,&local_321);
                                        Error::Error(__return_storage_ptr__,&local_320);
                                        std::__cxx11::string::~string((string *)&local_320);
                                        std::allocator<char>::~allocator(&local_321);
                                      }
                                    }
                                    else {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_2f8,"Response JSON is incorrect",
                                                 &local_2f9);
                                      Error::Error(__return_storage_ptr__,&local_2f8);
                                      std::__cxx11::string::~string((string *)&local_2f8);
                                      std::allocator<char>::~allocator(&local_2f9);
                                    }
                                  }
                                  else {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_2d0,"Response JSON is incorrect",
                                               &local_2d1);
                                    Error::Error(__return_storage_ptr__,&local_2d0);
                                    std::__cxx11::string::~string((string *)&local_2d0);
                                    std::allocator<char>::~allocator(&local_2d1);
                                  }
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_2a8,"Response JSON is incorrect",
                                             &local_2a9);
                                  Error::Error(__return_storage_ptr__,&local_2a8);
                                  std::__cxx11::string::~string((string *)&local_2a8);
                                  std::allocator<char>::~allocator(&local_2a9);
                                }
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_280,"Response JSON is incorrect",
                                           &local_281);
                                Error::Error(__return_storage_ptr__,&local_280);
                                std::__cxx11::string::~string((string *)&local_280);
                                std::allocator<char>::~allocator(&local_281);
                              }
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_258,"Response JSON is incorrect",
                                         &local_259);
                              Error::Error(__return_storage_ptr__,&local_258);
                              std::__cxx11::string::~string((string *)&local_258);
                              std::allocator<char>::~allocator(&local_259);
                            }
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_230,"Response JSON is incorrect",&local_231)
                            ;
                            Error::Error(__return_storage_ptr__,&local_230);
                            std::__cxx11::string::~string((string *)&local_230);
                            std::allocator<char>::~allocator(&local_231);
                          }
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_208,"Response JSON is incorrect",&local_209);
                          Error::Error(__return_storage_ptr__,&local_208);
                          std::__cxx11::string::~string((string *)&local_208);
                          std::allocator<char>::~allocator(&local_209);
                        }
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1e0,"Response JSON is incorrect",&local_1e1);
                        Error::Error(__return_storage_ptr__,&local_1e0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::allocator<char>::~allocator(&local_1e1);
                      }
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_1b8,"Response JSON is incorrect",&local_1b9);
                      Error::Error(__return_storage_ptr__,&local_1b8);
                      std::__cxx11::string::~string((string *)&local_1b8);
                      std::allocator<char>::~allocator(&local_1b9);
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_190,"Response JSON is incorrect",&local_191);
                    Error::Error(__return_storage_ptr__,&local_190);
                    std::__cxx11::string::~string((string *)&local_190);
                    std::allocator<char>::~allocator(&local_191);
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_168,"Response JSON is incorrect",&local_169);
                  Error::Error(__return_storage_ptr__,&local_168);
                  std::__cxx11::string::~string((string *)&local_168);
                  std::allocator<char>::~allocator(&local_169);
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_140,"Response JSON is incorrect",&local_141);
                Error::Error(__return_storage_ptr__,&local_140);
                std::__cxx11::string::~string((string *)&local_140);
                std::allocator<char>::~allocator(&local_141);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_118,"Response JSON is incorrect",&local_119);
              Error::Error(__return_storage_ptr__,&local_118);
              std::__cxx11::string::~string((string *)&local_118);
              std::allocator<char>::~allocator(&local_119);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,"Response JSON is incorrect",&local_f1);
            Error::Error(__return_storage_ptr__,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::allocator<char>::~allocator(&local_f1);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"Response JSON is incorrect",&local_c9);
          Error::Error(__return_storage_ptr__,&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::allocator<char>::~allocator(&local_c9);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"Response JSON is incorrect",&local_a1);
        Error::Error(__return_storage_ptr__,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Response JSON is incorrect",&local_79);
      Error::Error(__return_storage_ptr__,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Response JSON is incorrect",&local_41);
    Error::Error(__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Task::deserialize_response(const rapidjson::Value &value) {
    CHECK_TYPE(value, Object);
    GET_MEMBER(time_usage_ms_, value, "time_usage_ms", Int64);
    GET_MEMBER(time_usage_sys_ms_, value, "time_usage_sys_ms", Int64);
    GET_MEMBER(time_usage_user_ms_, value, "time_usage_user_ms", Int64);
    GET_MEMBER(wall_time_usage_ms_, value, "wall_time_usage_ms", Int64);
    GET_MEMBER(memory_usage_kb_, value, "memory_usage_kb", Int64);
    GET_MEMBER(time_limit_exceeded_, value, "time_limit_exceeded", Bool);
    GET_MEMBER(wall_time_limit_exceeded_, value, "wall_time_limit_exceeded", Bool);
    GET_MEMBER(exited_, value, "exited", Bool);
    GET_MEMBER(exit_code_, value, "exit_code", Int);
    GET_MEMBER(signaled_, value, "signaled", Bool);
    GET_MEMBER(term_signal_, value, "term_signal", Int);
    GET_MEMBER(oom_killed_, value, "oom_killed", Bool);
    GET_MEMBER(memory_limit_hit_, value, "memory_limit_hit", Bool);
    return Error();
}